

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atf-c-leakcheck.h
# Opt level: O2

void check_for_fd_leaks(void)

{
  int iVar1;
  char *pcVar2;
  undefined8 uStack_20;
  int fds_2 [2];
  int fds_1 [2];
  
  iVar1 = pipe2(fds_1,0x80000);
  if (iVar1 == 0) {
    iVar1 = pipe2(fds_2,0x80000);
    if (iVar1 == 0) {
      if (fds_1[0] == fd_leak_test_a) {
        if (fds_1[1] == fd_leak_test_b) {
          if (fds_2[0] == fd_leak_test_c) {
            if (fds_2[1] == fd_leak_test_d) {
              iVar1 = close(fds_1[0]);
              if (iVar1 == 0) {
                iVar1 = close(fds_1[1]);
                if (iVar1 == 0) {
                  iVar1 = close(fds_2[0]);
                  if (iVar1 == 0) {
                    iVar1 = close(fds_2[1]);
                    if (iVar1 == 0) {
                      return;
                    }
                    pcVar2 = "close(fds_2[1]) == 0";
                    uStack_20 = 0x3c;
                  }
                  else {
                    pcVar2 = "close(fds_2[0]) == 0";
                    uStack_20 = 0x3b;
                  }
                }
                else {
                  pcVar2 = "close(fds_1[1]) == 0";
                  uStack_20 = 0x3a;
                }
              }
              else {
                pcVar2 = "close(fds_1[0]) == 0";
                uStack_20 = 0x39;
              }
            }
            else {
              pcVar2 = "fds_2[1] == fd_leak_test_d";
              uStack_20 = 0x37;
            }
          }
          else {
            pcVar2 = "fds_2[0] == fd_leak_test_c";
            uStack_20 = 0x36;
          }
        }
        else {
          pcVar2 = "fds_1[1] == fd_leak_test_b";
          uStack_20 = 0x35;
        }
      }
      else {
        pcVar2 = "fds_1[0] == fd_leak_test_a";
        uStack_20 = 0x34;
      }
    }
    else {
      pcVar2 = "pipe2(fds_2, O_CLOEXEC) == 0";
      uStack_20 = 0x32;
    }
  }
  else {
    pcVar2 = "pipe2(fds_1, O_CLOEXEC) == 0";
    uStack_20 = 0x2f;
  }
  microatf_fail_require
            ("%s:%d: %s not met",
             "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/atf-c-leakcheck.h"
             ,uStack_20,pcVar2);
}

Assistant:

static void
check_for_fd_leaks(void)
{
	/* Test that all fds of previous tests
	 * have been closed successfully. */

	int fds_1[2];
	ATF_REQUIRE(pipe2(fds_1, O_CLOEXEC) == 0);

	int fds_2[2];
	ATF_REQUIRE(pipe2(fds_2, O_CLOEXEC) == 0);

	ATF_REQUIRE(fds_1[0] == fd_leak_test_a);
	ATF_REQUIRE(fds_1[1] == fd_leak_test_b);
	ATF_REQUIRE(fds_2[0] == fd_leak_test_c);
	ATF_REQUIRE(fds_2[1] == fd_leak_test_d);

	ATF_REQUIRE(close(fds_1[0]) == 0);
	ATF_REQUIRE(close(fds_1[1]) == 0);
	ATF_REQUIRE(close(fds_2[0]) == 0);
	ATF_REQUIRE(close(fds_2[1]) == 0);
}